

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration * __thiscall absl::lts_20250127::Duration::operator*=(Duration *this,double r)

{
  bool bVar1;
  int64_t iVar2;
  Duration DVar3;
  HiRep local_d0;
  uint32_t local_c8;
  HiRep local_98;
  uint32_t local_90;
  HiRep local_88;
  uint32_t local_80;
  HiRep local_4c;
  uint32_t local_44;
  bool is_neg;
  double r_local;
  Duration *this_local;
  
  bVar1 = time_internal::IsInfiniteDuration(*this);
  if ((!bVar1) && (bVar1 = anon_unknown_1::IsFinite(r), bVar1)) {
    DVar3 = anon_unknown_1::ScaleDouble<std::multiplies>(*this,r);
    local_d0 = DVar3.rep_hi_;
    local_c8 = DVar3.rep_lo_;
    this->rep_hi_ = local_d0;
    this->rep_lo_ = local_c8;
    return this;
  }
  bVar1 = std::signbit(r);
  iVar2 = HiRep::Get(&this->rep_hi_);
  if (bVar1 == iVar2 < 0) {
    DVar3 = InfiniteDuration();
    local_98 = DVar3.rep_hi_;
    local_4c = local_98;
    local_90 = DVar3.rep_lo_;
    local_44 = local_90;
  }
  else {
    DVar3 = InfiniteDuration();
    DVar3 = lts_20250127::operator-(DVar3);
    local_88 = DVar3.rep_hi_;
    local_4c = local_88;
    local_80 = DVar3.rep_lo_;
    local_44 = local_80;
  }
  this->rep_hi_ = local_4c;
  this->rep_lo_ = local_44;
  return this;
}

Assistant:

Duration& Duration::operator*=(double r) {
  if (time_internal::IsInfiniteDuration(*this) || !IsFinite(r)) {
    const bool is_neg = std::signbit(r) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleDouble<std::multiplies>(*this, r);
}